

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::serialize<binlog::detail::VectorOutputStream>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               VectorOutputStream *ostream)

{
  uint t;
  
  t = (uint)s->_M_string_length;
  TrivialSerializer<unsigned_int>::serialize<binlog::detail::VectorOutputStream>(t,ostream);
  serialize_elems<binlog::detail::VectorOutputStream>(s,t,ostream);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }